

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProc.h
# Opt level: O3

void __thiscall ImageProc::smoothPerimeter(ImageProc *this,float smoothParam)

{
  pointer pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  Point2f pnt;
  Point_<float> local_b8;
  Point_<float> local_b0;
  Point_<float> local_a8;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  Point_<float> local_78;
  undefined8 uStack_70;
  Point_<float> local_68;
  undefined8 uStack_60;
  Point_<float> local_58;
  undefined8 uStack_50;
  Point_<float> local_48;
  undefined8 uStack_40;
  undefined1 auVar6 [16];
  
  if ((smoothParam < 1.0) && (0.0 < smoothParam)) {
    fVar11 = (float)(ulong)((long)(this->BoundaryPoints).
                                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->BoundaryPoints).
                                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * smoothParam +
             -3.0;
    if (0.0 < fVar11) {
      iVar3 = (int)(1.0 / smoothParam + 1.0 / smoothParam);
      local_98._0_4_ = 0.0;
      local_98._4_4_ = 0;
      local_98._12_4_ = 0;
      iVar2 = 0;
      local_88 = smoothParam;
      fStack_84 = smoothParam;
      fStack_80 = smoothParam;
      fStack_7c = smoothParam;
      do {
        fVar10 = (float)(iVar2 + 1);
        auVar9 = ZEXT416((uint)fVar10);
        if (0 < iVar3) {
          auVar5._4_4_ = local_98._4_4_;
          auVar5._0_4_ = local_98._0_4_;
          pPVar1 = (this->BoundaryPoints).
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          auVar5._8_4_ = local_98._4_4_;
          auVar5._12_4_ = local_98._12_4_;
          auVar7._8_8_ = auVar5._8_8_;
          auVar7._4_4_ = fVar10;
          auVar7._0_4_ = local_98._0_4_;
          auVar6._0_12_ = auVar7._0_12_;
          auVar6._12_4_ = 0;
          auVar9._4_4_ = fStack_84;
          auVar9._0_4_ = local_88;
          auVar9._8_4_ = fStack_80;
          auVar9._12_4_ = fStack_7c;
          auVar7 = divps(auVar6,auVar9);
          local_48 = pPVar1[(int)auVar7._0_4_];
          uStack_40._0_1_ = (Mat)0x0;
          uStack_40._1_7_ = 0;
          local_58 = pPVar1[(int)auVar7._4_4_];
          uStack_50 = 0;
          auVar8._0_4_ = (float)(iVar2 + 2);
          auVar8._4_4_ = (float)(iVar2 + 3);
          auVar8._8_8_ = 0;
          auVar9 = divps(auVar8,auVar9);
          local_68 = pPVar1[(int)auVar9._0_4_];
          uStack_60 = 0;
          local_78 = pPVar1[(int)auVar9._4_4_];
          uStack_70 = 0;
          iVar4 = 0;
          local_98 = ZEXT416((uint)fVar10);
          do {
            local_a8 = local_48;
            local_b0 = local_58;
            local_b8 = local_68;
            pointOnCurve((ImageProc *)local_a0,(Point2f *)this,&local_a8,&local_b0,&local_b8,
                         (float)iVar4 * smoothParam * 0.5);
            std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                      (&this->SmoothedBoundaryPoints,(value_type *)local_a0);
            iVar4 = iVar4 + 1;
            auVar9 = local_98;
          } while (iVar3 != iVar4);
        }
        local_98 = auVar9;
        iVar2 = iVar2 + 1;
      } while ((float)local_98._0_4_ < fVar11);
    }
    local_a0 = *(undefined1 (*) [8])
                (this->SmoothedBoundaryPoints).
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                super__Vector_impl_data._M_start;
    std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::
    emplace_back<cv::Point_<float>>
              ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)
               &this->SmoothedBoundaryPoints,(Point_<float> *)local_a0);
    pPVar1 = (this->BoundaryPoints).
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->BoundaryPoints).
        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pPVar1) {
      (this->BoundaryPoints).
      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar1;
    }
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
              (&this->BoundaryPoints,&this->SmoothedBoundaryPoints);
  }
  return;
}

Assistant:

void smoothPerimeter(float smoothParam)
	{
		// if given params is out of range return unsmoothed version of perimeter
		if (smoothParam >= 1 || smoothParam <=0)
		{
			return;
		}
			
		std::vector<cv::Point2f> splinePoints;
		double stepsize=1/smoothParam;	
		float length= BoundaryPoints.size() * smoothParam;

		for (int i = 0; i < length - 3; i++)
		{
			cv::Point2f p0= BoundaryPoints[(int)(i/ smoothParam)]; 
			cv::Point2f p1 = BoundaryPoints[(int)((i+1) / smoothParam)];
			cv::Point2f p2 = BoundaryPoints[(int)((i+2) / smoothParam)];
			cv::Point2f p3 = BoundaryPoints[(int)((i+3) / smoothParam)];

			for (int j = 0; j < (int)(2*stepsize); j++)
			{
				//std::cout << j << " " ;
				cv::Point2f pnt= pointOnCurve(p0,  p1,  p2, p3, smoothParam/2*j);
				SmoothedBoundaryPoints.push_back(pnt);
			}
		}
		cv::Point2d first = SmoothedBoundaryPoints[0];
		SmoothedBoundaryPoints.push_back(first);

		BoundaryPoints.clear();		
		BoundaryPoints=SmoothedBoundaryPoints;
		
	}